

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
SharedPtrTests_advanced_Destructor2_Test::~SharedPtrTests_advanced_Destructor2_Test
          (SharedPtrTests_advanced_Destructor2_Test *this)

{
  SharedPtrTests_advanced_Destructor2_Test *this_local;
  
  ~SharedPtrTests_advanced_Destructor2_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SharedPtrTests_advanced, Destructor2) {
	int* a;
	a = new int;
	*a = 1234;
	SharedPtr<int> t1(a);
	SharedPtr<int> t2(t1);
	t2.~SharedPtr();
	EXPECT_EQ(t1.use_count(), 1);
}